

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_best_tri_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  uint uVar1;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_DBL min_bary;
  REF_DBL best_bary;
  REF_DBL current_bary3 [3];
  int local_154;
  int local_150;
  REF_INT j;
  REF_INT i;
  REF_INT tet1;
  REF_INT tet0;
  REF_INT best_candidate;
  REF_INT tri_candidate;
  REF_INT item;
  REF_INT tet_nodes [27];
  REF_INT tri_nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_tet;
  REF_CELL ref_tri;
  REF_DBL *bary_local;
  REF_INT *cell_local;
  REF_DBL *xyz_local;
  REF_LIST ref_list_local;
  REF_INTERP ref_interp_local;
  
  ref_cell = ref_interp->from_tri;
  ref_cell_00 = ref_interp->from_tet;
  ref_node_00 = ref_interp->from_grid->node;
  tet1 = -1;
  min_bary = -999.0;
  best_candidate = 0;
  while( true ) {
    if (ref_list->n <= best_candidate) {
      if (tet1 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1dd,"ref_interp_best_tri_in_list","failed to find tri");
        ref_interp_local._4_4_ = 1;
      }
      else {
        ref_interp_local._4_4_ = ref_cell_nodes(ref_cell,tet1,tet_nodes + 0x1a);
        if (ref_interp_local._4_4_ == 0) {
          ref_interp_local._4_4_ = ref_node_bary3d(ref_node_00,tet_nodes + 0x1a,xyz,&best_bary);
          if (ref_interp_local._4_4_ == 0) {
            ref_interp_local._4_4_ = ref_cell_with_face(ref_cell_00,tet_nodes + 0x1a,&i,&j);
            if (ref_interp_local._4_4_ == 0) {
              if (i == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x1e3,"ref_interp_best_tri_in_list","no tet for tri");
                ref_interp_local._4_4_ = 1;
              }
              else if ((long)j == -1) {
                *cell = i;
                ref_interp_local._4_4_ = ref_cell_nodes(ref_cell_00,i,&tri_candidate);
                if (ref_interp_local._4_4_ == 0) {
                  for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
                    bary[local_150] = 0.0;
                    for (local_154 = 0; local_154 < 3; local_154 = local_154 + 1) {
                      if (tet_nodes[(long)local_154 + 0x1a] == (&tri_candidate)[local_150]) {
                        bary[local_150] = current_bary3[(long)local_154 + -1];
                      }
                    }
                  }
                  ref_interp_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x1e7,"ref_interp_best_tri_in_list",(ulong)ref_interp_local._4_4_,"cell");
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x1e4,"ref_interp_best_tri_in_list","found two tets for boundary face",
                       0xffffffffffffffff,(long)j);
                ref_interp_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x1e2,"ref_interp_best_tri_in_list",(ulong)ref_interp_local._4_4_,
                     "find with face");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x1e0,"ref_interp_best_tri_in_list",(ulong)ref_interp_local._4_4_,"bary3d");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x1df,"ref_interp_best_tri_in_list",(ulong)ref_interp_local._4_4_,"cell");
        }
      }
      return ref_interp_local._4_4_;
    }
    tet0 = ref_list->value[best_candidate];
    uVar1 = ref_cell_nodes(ref_cell,tet0,tet_nodes + 0x1a);
    if (uVar1 != 0) break;
    uVar1 = ref_node_bary3d(ref_node_00,tet_nodes + 0x1a,xyz,&best_bary);
    if ((uVar1 != 0) && (uVar1 != 4)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x1d2,"ref_interp_best_tri_in_list",(ulong)uVar1,"bary");
      return uVar1;
    }
    if (uVar1 == 0) {
      if (current_bary3[0] <= best_bary) {
        local_1c0 = current_bary3[0];
      }
      else {
        local_1c0 = best_bary;
      }
      if (current_bary3[1] <= local_1c0) {
        local_1d0 = current_bary3[1];
      }
      else {
        if (current_bary3[0] <= best_bary) {
          local_1c8 = current_bary3[0];
        }
        else {
          local_1c8 = best_bary;
        }
        local_1d0 = local_1c8;
      }
      if ((tet1 == -1) || (min_bary < local_1d0)) {
        tet1 = tet0;
        min_bary = local_1d0;
      }
    }
    best_candidate = best_candidate + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x1d0,
         "ref_interp_best_tri_in_list",(ulong)uVar1,"cell");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_best_tri_in_list(REF_INTERP ref_interp,
                                                      REF_LIST ref_list,
                                                      REF_DBL *xyz,
                                                      REF_INT *cell,
                                                      REF_DBL *bary) {
  REF_CELL ref_tri = ref_interp_from_tri(ref_interp);
  REF_CELL ref_tet = ref_interp_from_tet(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, tri_candidate, best_candidate, tet0, tet1, i, j;
  REF_DBL current_bary3[3];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    tri_candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_tri, tri_candidate, tri_nodes), "cell");
    status = ref_node_bary3d(ref_node, tri_nodes, xyz, current_bary3);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary3[0], current_bary3[1]), current_bary3[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = tri_candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find tri");

  RSS(ref_cell_nodes(ref_tri, best_candidate, tri_nodes), "cell");
  RSS(ref_node_bary3d(ref_node, tri_nodes, xyz, current_bary3), "bary3d");
  tri_nodes[3] = tri_nodes[0];
  RSS(ref_cell_with_face(ref_tet, tri_nodes, &tet0, &tet1), "find with face");
  RUS(REF_EMPTY, tet0, "no tet for tri");
  REIS(REF_EMPTY, tet1, "found two tets for boundary face");

  *cell = tet0;
  RSS(ref_cell_nodes(ref_tet, tet0, tet_nodes), "cell");
  for (i = 0; i < 4; i++) {
    bary[i] = 0.0;
    for (j = 0; j < 3; j++) {
      if (tri_nodes[j] == tet_nodes[i]) bary[i] = current_bary3[j];
    }
  }

  return REF_SUCCESS;
}